

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapColorizeFilter::QPixmapColorizeFilter(QPixmapColorizeFilter *this,QObject *parent)

{
  long lVar1;
  QPixmapColorizeFilterPrivate *pQVar2;
  QPixmapFilterPrivate *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QPixmapColorizeFilterPrivate *d;
  undefined8 in_stack_ffffffffffffffd0;
  FilterType type;
  QObject *this_00;
  int in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined2 in_stack_ffffffffffffffee;
  undefined6 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff6;
  
  type = (FilterType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = (QPixmapColorizeFilterPrivate *)operator_new(0xa0);
  QPixmapColorizeFilterPrivate::QPixmapColorizeFilterPrivate(pQVar2);
  QPixmapFilter::QPixmapFilter((QPixmapFilter *)this_00,in_RSI,type,in_RDI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0ce08;
  pQVar2 = d_func((QPixmapColorizeFilter *)0x4acca2);
  QColor::QColor((QColor *)CONCAT26(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0),
                 CONCAT22(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec),
                 in_stack_ffffffffffffffe8,(int)((ulong)this_00 >> 0x20),(int)this_00);
  *(ulong *)&pQVar2->field_0x82 = CONCAT62(in_stack_fffffffffffffff0,in_stack_ffffffffffffffee);
  *(ulong *)&(pQVar2->super_QPixmapFilterPrivate).field_0x7c =
       CONCAT26(in_stack_ffffffffffffffee,
                CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  pQVar2->strength = 1.0;
  *(uint *)&pQVar2->field_0x98 = *(uint *)&pQVar2->field_0x98 | 1;
  *(uint *)&pQVar2->field_0x98 = *(uint *)&pQVar2->field_0x98 & 0xfffffffd;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPixmapColorizeFilter::QPixmapColorizeFilter(QObject *parent)
    : QPixmapFilter(*new QPixmapColorizeFilterPrivate, ColorizeFilter, parent)
{
    Q_D(QPixmapColorizeFilter);
    d->color = QColor(0, 0, 192);
    d->strength = qreal(1);
    d->opaque = true;
    d->alphaBlend = false;
}